

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encryptor_test.cpp
# Opt level: O0

string * to_string_abi_cxx11_(uchar *ptr,size_t n)

{
  ulong in_RDX;
  long in_RSI;
  string *in_RDI;
  char buf [3];
  uint i;
  string *res;
  char local_23 [3];
  uint local_20;
  undefined1 local_19;
  ulong local_18;
  long local_10;
  
  local_19 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
    sprintf(local_23,"%02x",(ulong)*(byte *)(local_10 + (ulong)local_20));
    std::__cxx11::string::operator+=(in_RDI,local_23);
  }
  return in_RDI;
}

Assistant:

std::string to_string(unsigned char *ptr,size_t n)
{
	std::string res;
	for(unsigned i=0;i<n;i++) {
		char buf[3];
		sprintf(buf,"%02x",ptr[i]);
		res+=buf;
	}
	return res;
}